

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

void __thiscall
bgui::FileImageWindow::FileImageWindow
          (FileImageWindow *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,int firstfile,bool watch,int x,int y,int w,int h,bool size_max,double init_scale,
          double init_min,double init_max,double valid_min,double valid_max,keep k,mapping m,int c,
          char *viewcmd)

{
  char *pcVar1;
  bool size_max_00;
  IOException *this_00;
  int w_00;
  int h_00;
  string local_1c8;
  string local_1a8 [11];
  
  h_00 = h;
  w_00 = w;
  ImageWindow::ImageWindow(&this->super_ImageWindow);
  (this->super_ImageWindow).super_BaseWindow._vptr_BaseWindow =
       (_func_int **)&PTR__FileImageWindow_00122a10;
  (this->vc)._M_dataplus._M_p = (pointer)&(this->vc).field_2;
  (this->vc)._M_string_length = 0;
  (this->vc).field_2._M_local_buf[0] = '\0';
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)local_1a8,"The list of files must not be empty",(allocator *)&local_1c8);
    gutil::IOException::IOException(this_00,local_1a8);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,"Files:\n");
  std::operator<<((ostream *)local_1a8,"<cursor left>  Load previous image\n");
  std::operator<<((ostream *)local_1a8,"<cursor right> Load next image\n");
  std::operator<<((ostream *)local_1a8,
                  "\'u\'            Reload current image and toggle watching the current image for changes\n"
                 );
  std::operator<<((ostream *)local_1a8,
                  "\'k\'            Switch between keep, keep_all and not keeping the settings when (re)loading\n"
                 );
  std::operator<<((ostream *)local_1a8,
                  "\'c\'            Capture current content of the window and store it next to the original image\n"
                 );
  std::operator<<((ostream *)local_1a8,
                  "\'d\'            Rename current image by adding the suffix .bak and remove it from the list\n"
                 );
  pcVar1 = viewcmd;
  if (viewcmd != (char *)0x0) {
    std::operator<<((ostream *)local_1a8,"\n");
    std::operator<<((ostream *)local_1a8,"3D Visualization:\n");
    std::operator<<((ostream *)local_1a8,
                    "\'p\'            Open part of disparity image (with parameter file) in plyv\n")
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ImageWindow::addHelpText(&this->super_ImageWindow,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->vc);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->list,files);
  this->current = firstfile;
  this->scale = init_scale;
  this->imin = init_min;
  this->imax = init_max;
  this->vmin = valid_min;
  this->vmax = valid_max;
  this->kp = k;
  this->map = m;
  this->channel = c;
  this->watch_file = watch;
  this->wid = -1;
  size_max_00 = size_max;
  if (w_00 < 1 || h_00 < 1) {
    BaseWindow::getDisplaySize((BaseWindow *)this,&w,&h);
    h_00 = h;
    w_00 = w;
    size_max_00 = true;
  }
  load(this,&this->current,true,w_00,h_00,size_max_00);
  BaseWindow::setVisible((BaseWindow *)this,true);
  if (-1 < (y | x)) {
    BaseWindow::setPosition((BaseWindow *)this,x,y);
  }
  return;
}

Assistant:

FileImageWindow::FileImageWindow(const std::vector<std::string> &files, int firstfile,
                                 bool watch, int x, int y, int w, int h, bool size_max, double init_scale,
                                 double init_min, double init_max, double valid_min, double valid_max, keep k,
                                 mapping m, int c, const char *viewcmd)
{
  if (files.empty())
  {
    throw gutil::IOException("The list of files must not be empty");
  }

  addHelpText(createHelpText(viewcmd != 0));

  if (viewcmd != 0)
  {
    vc=viewcmd;
  }

  list=files;
  current=firstfile;

  scale=init_scale;
  imin=init_min;
  imax=init_max;
  vmin=valid_min;
  vmax=valid_max;
  kp=k;
  map=m;
  channel=c;
  watch_file=watch;
  wid=-1;

  if (w <= 0 || h <= 0)
  {
    getDisplaySize(w, h);
    size_max=true;
  }

  load(current, true, w, h, size_max);

  setVisible(true);

  if (x >= 0 && y >= 0)
  {
    setPosition(x, y);
  }
}